

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O2

void __thiscall lambda::parse_from::helper::comment(helper *this)

{
  int iVar1;
  Parse_error *this_00;
  Shared_string local_30;
  
  iVar1 = std::istream::get();
LAB_00103112:
  do {
    if (iVar1 == 0x28) {
      iVar1 = std::istream::peek();
      if (iVar1 == 0x2a) {
        std::istream::get();
        comment(this);
        iVar1 = 0x28;
        goto LAB_00103112;
      }
    }
    else if (iVar1 == 0x2a) {
      iVar1 = std::istream::peek();
      if (iVar1 == 0x29) {
        std::istream::get();
        return;
      }
    }
    iVar1 = std::istream::get();
    if (iVar1 == -1) {
      this_00 = (Parse_error *)__cxa_allocate_exception(0x20);
      ublib::Shared_string::Shared_string(&local_30,"unexpected end of file");
      Parse_error::Parse_error(this_00,&local_30);
      __cxa_throw(this_00,&Parse_error::typeinfo,Parse_error::~Parse_error);
    }
  } while( true );
}

Assistant:

void comment() {
      auto ch = inp.get();
      for (;;) {
        if (ch == '*' and inp.peek() == ')') {
          inp.get();
          return;
        } else if (ch == '(' and inp.peek() == '*') {
          inp.get();
          comment();
        } else {
          ch = inp.get();
          if (ch == eof) {
            throw Parse_error("unexpected end of file");
          }
        }
      }
    }